

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QModelIndex * __thiscall
QTreeView::moveCursor(QTreeView *this,CursorAction cursorAction,KeyboardModifiers modifiers)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTreeViewPrivate *this_00;
  qsizetype qVar6;
  int *piVar7;
  const_reference pQVar8;
  QStyle *pQVar9;
  int in_EDX;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *par;
  int oldValue_1;
  QScrollBar *sb_1;
  int newColumn_1;
  int visualColumn_1;
  bool descend_1;
  int oldValue;
  int newColumn;
  int visualColumn;
  bool descend;
  QScrollBar *sb;
  int vi;
  int c;
  int i;
  QTreeViewPrivate *d;
  QModelIndex current;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  QTreeViewPrivate *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  QTreeViewPrivate *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 emitSignal;
  int in_stack_fffffffffffffe4c;
  QTreeViewPrivate *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QTreeViewPrivate *in_stack_fffffffffffffe70;
  bool local_159;
  bool local_14d;
  bool local_f1;
  int local_c0;
  int local_b0;
  int local_98;
  int local_84;
  undefined1 local_70 [72];
  int local_28 [2];
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  emitSignal = (undefined1)((uint)in_stack_fffffffffffffe48 >> 0x18);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8fb517);
  QAbstractItemViewPrivate::executePostedLayout(in_stack_fffffffffffffe10);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffe20);
  bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe10);
  if (!bVar2) {
    iVar3 = QTreeViewPrivate::below(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    local_98 = 0;
    while( true ) {
      iVar4 = QHeaderView::count((QHeaderView *)in_stack_fffffffffffffe10);
      local_f1 = false;
      if (local_98 < iVar4) {
        QHeaderView::logicalIndex
                  ((QHeaderView *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        local_f1 = QHeaderView::isSectionHidden
                             ((QHeaderView *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                              (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      }
      if (local_f1 == false) break;
      local_98 = local_98 + 1;
    }
    qVar6 = QList<QTreeViewItem>::size(&this_00->viewItems);
    if ((iVar3 < qVar6) &&
       (iVar3 = QHeaderView::count((QHeaderView *)in_stack_fffffffffffffe10), local_98 < iVar3)) {
      QHeaderView::logicalIndex
                ((QHeaderView *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      QTreeViewPrivate::modelIndex
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    }
    else {
      QModelIndex::QModelIndex((QModelIndex *)0x8fb71a);
    }
    goto LAB_008fc203;
  }
  local_28[1] = 0;
  local_28[0] = QTreeViewPrivate::viewIndex
                          (in_stack_fffffffffffffe70,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  piVar7 = qMax<int>(local_28 + 1,local_28);
  iVar3 = *piVar7;
  bVar2 = QWidget::isRightToLeft((QWidget *)0x8fb771);
  local_84 = in_EDX;
  if (bVar2) {
    if (in_EDX == 3) {
      local_84 = 2;
    }
    else if (in_EDX == 2) {
      local_84 = 3;
    }
  }
  switch(local_84) {
  case 0:
  case 9:
    QTreeViewPrivate::above(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    break;
  case 1:
  case 8:
    QTreeViewPrivate::below(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    break;
  case 2:
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffe10);
    iVar4 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    qVar6 = QList<QTreeViewItem>::size(&this_00->viewItems);
    if (((iVar3 < qVar6) &&
        (pQVar8 = QList<QTreeViewItem>::at
                            ((QList<QTreeViewItem> *)in_stack_fffffffffffffe10,
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
        (*(ulong *)&pQVar8->field_0x1c & 1) != 0)) && ((this_00->itemsExpandable & 1U) != 0)) {
      iVar3 = QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
      iVar5 = QAbstractSlider::minimum((QAbstractSlider *)in_stack_fffffffffffffe10);
      if (iVar3 != iVar5) goto LAB_008fb971;
      QTreeViewPrivate::collapse
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(bool)emitSignal);
      (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
    }
    else {
LAB_008fb971:
      pQVar9 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      iVar3 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x4f,0,in_RSI);
      bVar2 = iVar3 != 0;
      if (bVar2) {
        *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
        in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffe20);
        bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe10);
        local_14d = false;
        if (bVar2) {
          QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_fffffffffffffe10);
          local_14d = ::operator!=((QModelIndex *)in_stack_fffffffffffffe10,
                                   (QModelIndex *)
                                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        }
        if (local_14d != false) break;
        bVar2 = false;
      }
      if (!bVar2) {
        if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior == SelectItems) ||
           ((this_00->super_QAbstractItemViewPrivate).selectionBehavior == SelectColumns)) {
          QModelIndex::column((QModelIndex *)&local_20);
          local_b0 = QHeaderView::visualIndex
                               ((QHeaderView *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),iVar4)
          ;
          do {
            local_b0 = local_b0 + -1;
            local_159 = false;
            if (-1 < local_b0) {
              QHeaderView::logicalIndex
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
              local_159 = isColumnHidden((QTreeView *)in_stack_fffffffffffffe10,
                                         in_stack_fffffffffffffe0c);
            }
          } while (local_159 != false);
          QHeaderView::logicalIndex
                    ((QHeaderView *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
          *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
          in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::row((QModelIndex *)&local_20);
          QModelIndex::sibling
                    ((QModelIndex *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                     in_stack_fffffffffffffe18);
          bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe10);
          if (bVar2) break;
        }
        iVar4 = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
        iVar3 = QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::singleStep((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   iVar4);
        iVar4 = QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        if (iVar3 != iVar4) {
          (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
        }
      }
    }
    (**(code **)(*in_RSI + 0x268))();
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe10);
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  default:
switchD_008fb7d6_default:
    *(undefined1 **)in_RDI = local_20;
    in_RDI->i = (quintptr)local_18;
    (in_RDI->m).ptr = local_10.ptr;
    break;
  case 3:
    qVar6 = QList<QTreeViewItem>::size(&this_00->viewItems);
    if (((iVar3 < qVar6) &&
        (pQVar8 = QList<QTreeViewItem>::at
                            ((QList<QTreeViewItem> *)in_stack_fffffffffffffe10,
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
        (*(ulong *)&pQVar8->field_0x1c & 1) == 0)) && ((this_00->itemsExpandable & 1U) != 0)) {
      QList<QTreeViewItem>::at
                ((QList<QTreeViewItem> *)in_stack_fffffffffffffe10,
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar2 = QTreeViewPrivate::hasVisibleChildren
                        ((QTreeViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         (QModelIndex *)in_stack_fffffffffffffe20);
      if (!bVar2) goto LAB_008fbd5f;
      QTreeViewPrivate::expand
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                 SUB41((uint)in_stack_fffffffffffffe18 >> 0x18,0));
      (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
    }
    else {
LAB_008fbd5f:
      pQVar9 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      iVar3 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x4f,0,in_RSI);
      bVar2 = iVar3 != 0;
      if (bVar2) {
        *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
        in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QTreeViewPrivate::below(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        QTreeViewPrivate::modelIndex
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
        QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffe20);
        bVar2 = ::operator==((QModelIndex *)in_stack_fffffffffffffe10,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (bVar2) break;
        bVar2 = false;
      }
      iVar3 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      if (!bVar2) {
        if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior == SelectItems) ||
           ((this_00->super_QAbstractItemViewPrivate).selectionBehavior == SelectColumns)) {
          QModelIndex::column((QModelIndex *)&local_20);
          local_c0 = QHeaderView::visualIndex
                               ((QHeaderView *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),iVar3)
          ;
          do {
            local_c0 = local_c0 + 1;
            pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
            iVar3 = local_c0;
            QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffe20);
            iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_70);
            bVar2 = false;
            if (iVar3 < iVar4) {
              QHeaderView::logicalIndex
                        ((QHeaderView *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
              bVar2 = isColumnHidden((QTreeView *)in_stack_fffffffffffffe10,
                                     in_stack_fffffffffffffe0c);
            }
          } while (bVar2 != false);
          QHeaderView::logicalIndex
                    ((QHeaderView *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
          *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
          in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::row((QModelIndex *)&local_20);
          QModelIndex::sibling
                    ((QModelIndex *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                     in_stack_fffffffffffffe18);
          bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe10);
          if (bVar2) break;
        }
        iVar4 = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
        QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffe10);
        iVar3 = QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::singleStep((QAbstractSlider *)in_stack_fffffffffffffe10);
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   iVar4);
        iVar4 = QAbstractSlider::value((QAbstractSlider *)in_stack_fffffffffffffe10);
        if (iVar3 != iVar4) {
          (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
        }
      }
    }
    (**(code **)(*in_RSI + 0x268))();
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe10);
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    goto switchD_008fb7d6_default;
  case 4:
    iVar3 = QTreeViewPrivate::itemForKeyHome(this_00);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex(in_stack_fffffffffffffe30,iVar3,in_stack_fffffffffffffe28);
    break;
  case 5:
    QTreeViewPrivate::itemForKeyEnd(in_stack_fffffffffffffe20);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    break;
  case 6:
    QTreeViewPrivate::pageUp(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    break;
  case 7:
    QTreeViewPrivate::pageDown(this_00,in_stack_fffffffffffffe2c);
    QModelIndex::column((QModelIndex *)&local_20);
    QTreeViewPrivate::modelIndex(this_00,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
  }
LAB_008fc203:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QModelIndex QTreeView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTreeView);
    Q_UNUSED(modifiers);

    d->executePostedLayout();

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int i = d->below(-1);
        int c = 0;
        while (c < d->header->count() && d->header->isSectionHidden(d->header->logicalIndex(c)))
            ++c;
        if (i < d->viewItems.size() && c < d->header->count()) {
            return d->modelIndex(i, d->header->logicalIndex(c));
        }
        return QModelIndex();
    }

    const int vi = qMax(0, d->viewIndex(current));

    if (isRightToLeft()) {
        if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
        else if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
    }
    switch (cursorAction) {
    case MoveNext:
    case MoveDown:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == d->viewItems.count()-1 && QApplicationPrivate::keypadNavigationEnabled())
            return d->model->index(0, current.column(), d->root);
#endif
        return d->modelIndex(d->below(vi), current.column());
    case MovePrevious:
    case MoveUp:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == 0 && QApplicationPrivate::keypadNavigationEnabled())
            return d->modelIndex(d->viewItems.count() - 1, current.column());
#endif
        return d->modelIndex(d->above(vi), current.column());
    case MoveLeft: {
        QScrollBar *sb = horizontalScrollBar();
        if (vi < d->viewItems.size() && d->viewItems.at(vi).expanded && d->itemsExpandable && sb->value() == sb->minimum()) {
            d->collapse(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex par = current.parent();
                if (par.isValid() && par != rootIndex())
                    return par;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) - 1;
                    while (visualColumn >= 0 && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn--;
                    int newColumn = d->header->logicalIndex(visualColumn);
                    QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                int oldValue = sb->value();
                sb->setValue(sb->value() - sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }

        }
        updateGeometries();
        viewport()->update();
        break;
    }
    case MoveRight:
        if (vi < d->viewItems.size() && !d->viewItems.at(vi).expanded && d->itemsExpandable
            && d->hasVisibleChildren(d->viewItems.at(vi).index)) {
            d->expand(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex idx = d->modelIndex(d->below(vi));
                if (idx.parent() == current)
                    return idx;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) + 1;
                    while (visualColumn < d->model->columnCount(current.parent()) && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn++;
                    const int newColumn = d->header->logicalIndex(visualColumn);
                    const QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                //last restort: we change the scrollbar value
                QScrollBar *sb = horizontalScrollBar();
                int oldValue = sb->value();
                sb->setValue(sb->value() + sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }
        }
        updateGeometries();
        viewport()->update();
        break;
    case MovePageUp:
        return d->modelIndex(d->pageUp(vi), current.column());
    case MovePageDown:
        return d->modelIndex(d->pageDown(vi), current.column());
    case MoveHome:
        return d->modelIndex(d->itemForKeyHome(), current.column());
    case MoveEnd:
        return d->modelIndex(d->itemForKeyEnd(), current.column());
    }
    return current;
}